

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlineprops.cpp
# Opt level: O1

void test_line_props(Am_Drawonable *d)

{
  (**(code **)(*(long *)d + 0xa0))();
  test_join_styles(d);
  test_cap_styles(d);
  test_dashes(d);
  test_stipples(d);
  test_polylines(d);
  (**(code **)(*(long *)d + 0xa0))(d);
  return;
}

Assistant:

void
test_line_props(Am_Drawonable *d)
{
  d->Flush_Output();

  test_join_styles(d);
  test_cap_styles(d);
  test_dashes(d);
  test_stipples(d);
  test_polylines(d);

  d->Flush_Output();
}